

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O0

void __thiscall
pbrt::FilmBaseParameters::FilmBaseParameters
          (FilmBaseParameters *this,Point2i fullResolution,Bounds2i pixelBounds,Filter *filter,
          Float diagonal,PixelSensor *sensor,string *filename)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  Filter *in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  string *in_stack_00000008;
  Filter *in_stack_ffffffffffffffa8;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  in_RDI[2] = in_RCX;
  Filter::Filter(in_R8,in_stack_ffffffffffffffa8);
  *(undefined4 *)(in_RDI + 4) = in_XMM0_Da;
  in_RDI[5] = in_R9;
  std::__cxx11::string::string((string *)(in_RDI + 6),in_stack_00000008);
  return;
}

Assistant:

FilmBaseParameters(Point2i fullResolution, Bounds2i pixelBounds, Filter filter,
                       Float diagonal, const PixelSensor *sensor, std::string filename)
        : fullResolution(fullResolution),
          pixelBounds(pixelBounds),
          filter(filter),
          diagonal(diagonal),
          sensor(sensor),
          filename(filename) {}